

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O2

void __thiscall vec<LitFlags>::growTo(vec<LitFlags> *this,uint size,LitFlags *pad)

{
  ulong uVar1;
  
  if (this->sz < size) {
    reserve(this,size);
    for (uVar1 = (ulong)this->sz; uVar1 < size; uVar1 = uVar1 + 1) {
      this->data[uVar1] = *pad;
    }
    this->sz = size;
  }
  return;
}

Assistant:

void growTo(unsigned int size, const T& pad) {
		if (size <= sz) {
			return;
		}
		reserve(size);
		for (unsigned int i = sz; i < size; i++) {
			new (&data[i]) T(pad);
		}
		sz = size;
	}